

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<int,kj::StringPtr>::Callbacks>::
insert<kj::TreeMap<int,kj::StringPtr>::Entry,int&>
          (TreeIndex<kj::TreeMap<int,kj::StringPtr>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<int,_kj::StringPtr>::Entry> table,size_t pos,int *params)

{
  ulong uVar1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  int *in_R9;
  ulong uVar3;
  Maybe<unsigned_long> MVar4;
  Iterator iter;
  Iterator IStack_68;
  size_t local_50;
  size_t local_48;
  SearchKey local_40;
  StringPtr *local_38;
  size_t *local_30;
  
  local_50 = table.size_;
  local_38 = table.ptr;
  local_30 = &local_50;
  local_40._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00237408;
  local_48 = pos;
  _::BTreeImpl::insert(&IStack_68,(BTreeImpl *)&(local_38->content).size_,&local_40);
  uVar3 = (ulong)IStack_68.row;
  if ((uVar3 != 0xe) && ((IStack_68.leaf)->rows[uVar3].i != 0)) {
    uVar1 = (ulong)((IStack_68.leaf)->rows[uVar3].i - 1);
    aVar2.value = uVar1 * 3;
    if (*(int *)(local_50 + uVar1 * 0x18) == *in_R9) {
      *this = (TreeIndex<kj::TreeMap<int,kj::StringPtr>::Callbacks>)0x1;
      *(ulong *)(this + 8) = uVar1;
      goto LAB_0018577c;
    }
  }
  memmove((IStack_68.leaf)->rows + uVar3 + 1,(IStack_68.leaf)->rows + uVar3,
          (ulong)(IStack_68.row + 1) * -4 + 0x38);
  (IStack_68.leaf)->rows[uVar3].i = (int)params + 1;
  *this = (TreeIndex<kj::TreeMap<int,kj::StringPtr>::Callbacks>)0x0;
  aVar2 = extraout_RDX;
LAB_0018577c:
  MVar4.ptr.field_1.value = aVar2.value;
  MVar4.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar4.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return kj::none;
    }
  }